

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal.c
# Opt level: O2

int run_test_we_get_signal_one_shot(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  timer_ctx tc;
  signal_ctx sc;
  
  puVar2 = (uv_loop_t *)uv_default_loop();
  start_timer(puVar2,0x11,&tc);
  start_watcher(puVar2,0x11,&sc,1);
  sc.stop_or_close = NOOP;
  iVar1 = uv_run(puVar2,0);
  if (iVar1 == 0) {
    if (tc.ncalls == 10) {
      if (sc.ncalls == 1) {
        start_timer(puVar2,0x11,&tc);
        iVar1 = uv_run(puVar2,0);
        if (iVar1 == 0) {
          if (sc.ncalls == 1) {
            sc.stop_or_close = CLOSE;
            sc.ncalls = 0;
            uv_signal_start_oneshot(&sc.handle,signal_cb_one_shot,0x11);
            start_timer(puVar2,0x11,&tc);
            iVar1 = uv_run(puVar2,0);
            if (iVar1 == 0) {
              if (tc.ncalls == 10) {
                if (sc.ncalls == 1) {
                  puVar2 = (uv_loop_t *)uv_default_loop();
                  close_loop(puVar2);
                  uVar3 = uv_default_loop();
                  iVar1 = uv_loop_close(uVar3);
                  if (iVar1 == 0) {
                    return 0;
                  }
                  pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                  uVar3 = 0xee;
                }
                else {
                  pcVar4 = "sc.ncalls == 1";
                  uVar3 = 0xec;
                }
              }
              else {
                pcVar4 = "tc.ncalls == NSIGNALS";
                uVar3 = 0xeb;
              }
            }
            else {
              pcVar4 = "0 == uv_run(loop, UV_RUN_DEFAULT)";
              uVar3 = 0xea;
            }
          }
          else {
            pcVar4 = "sc.ncalls == 1";
            uVar3 = 0xe4;
          }
        }
        else {
          pcVar4 = "0 == uv_run(loop, UV_RUN_DEFAULT)";
          uVar3 = 0xe3;
        }
      }
      else {
        pcVar4 = "sc.ncalls == 1";
        uVar3 = 0xe0;
      }
    }
    else {
      pcVar4 = "tc.ncalls == NSIGNALS";
      uVar3 = 0xdf;
    }
  }
  else {
    pcVar4 = "0 == uv_run(loop, UV_RUN_DEFAULT)";
    uVar3 = 0xde;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-signal.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(we_get_signal_one_shot) {
  struct signal_ctx sc;
  struct timer_ctx tc;
  uv_loop_t* loop;

  loop = uv_default_loop();
  start_timer(loop, SIGCHLD, &tc);
  start_watcher(loop, SIGCHLD, &sc, 1);
  sc.stop_or_close = NOOP;
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(tc.ncalls == NSIGNALS);
  ASSERT(sc.ncalls == 1);

  start_timer(loop, SIGCHLD, &tc);
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(sc.ncalls == 1);

  sc.ncalls = 0;
  sc.stop_or_close = CLOSE; /* now close it when it's done */
  uv_signal_start_oneshot(&sc.handle, signal_cb_one_shot, SIGCHLD);
  start_timer(loop, SIGCHLD, &tc);
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(tc.ncalls == NSIGNALS);
  ASSERT(sc.ncalls == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}